

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void SaveSettings(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  uint uVar4;
  ImGuiIniData *pIVar5;
  FILE *__stream;
  char *pcVar6;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  
  pIVar3 = GImGui;
  pcVar7 = (GImGui->IO).IniFilename;
  if (pcVar7 != (char *)0x0) {
    uVar4 = (GImGui->Windows).Size;
    if (uVar4 != 0) {
      uVar9 = 0;
      do {
        if ((long)(int)uVar4 <= (long)uVar9) {
          pcVar7 = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
          goto LAB_00132151;
        }
        pIVar2 = (pIVar3->Windows).Data[uVar9];
        if ((pIVar2->Flags & 0x100) == 0) {
          pIVar5 = FindWindowSettings(pIVar2->Name);
          pIVar5->Pos = pIVar2->Pos;
          pIVar5->Size = pIVar2->SizeFull;
          pIVar5->Collapsed = pIVar2->Collapsed;
          uVar4 = (pIVar3->Windows).Size;
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 != uVar4);
    }
    __stream = fopen(pcVar7,"wt");
    if (__stream != (FILE *)0x0) {
      uVar4 = (pIVar3->Settings).Size;
      if (uVar4 != 0) {
        lVar8 = 0x1c;
        uVar9 = 0;
        do {
          if ((long)(int)uVar4 <= (long)uVar9) {
            pcVar7 = "value_type &ImVector<ImGuiIniData>::operator[](int) [T = ImGuiIniData]";
LAB_00132151:
            __assert_fail("i < Size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                          ,0x353,pcVar7);
          }
          pIVar5 = (pIVar3->Settings).Data;
          fVar1 = *(float *)((long)pIVar5 + lVar8 + -0x10);
          if ((fVar1 != 3.4028235e+38) || (NAN(fVar1))) {
            pcVar7 = *(char **)((long)pIVar5 + lVar8 + -0x1c);
            pcVar6 = strstr(pcVar7,"###");
            if (pcVar6 != (char *)0x0) {
              pcVar7 = pcVar6;
            }
            fprintf(__stream,"[%s]\n",pcVar7);
            fprintf(__stream,"Pos=%d,%d\n",
                    (ulong)(uint)(int)*(float *)((long)pIVar5 + lVar8 + -0x10),
                    (ulong)(uint)(int)*(float *)((long)pIVar5 + lVar8 + -0xc));
            fprintf(__stream,"Size=%d,%d\n",(ulong)(uint)(int)*(float *)((long)pIVar5 + lVar8 + -8),
                    (ulong)(uint)(int)*(float *)((long)pIVar5 + lVar8 + -4));
            fprintf(__stream,"Collapsed=%d\n",(ulong)*(byte *)((long)&pIVar5->Name + lVar8));
            fputc(10,__stream);
            uVar4 = (pIVar3->Settings).Size;
          }
          uVar9 = uVar9 + 1;
          lVar8 = lVar8 + 0x20;
        } while (uVar9 != uVar4);
      }
      fclose(__stream);
      return;
    }
  }
  return;
}

Assistant:

static void SaveSettings()
{
    ImGuiContext& g = *GImGui;
    const char* filename = g.IO.IniFilename;
    if (!filename)
        return;

    // Gather data from windows that were active during this session
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        if (window->Flags & ImGuiWindowFlags_NoSavedSettings)
            continue;
        ImGuiIniData* settings = FindWindowSettings(window->Name);
        settings->Pos = window->Pos;
        settings->Size = window->SizeFull;
        settings->Collapsed = window->Collapsed;
    }

    // Write .ini file
    // If a window wasn't opened in this session we preserve its settings
    FILE* f = fopen(filename, "wt");
    if (!f)
        return;
    for (int i = 0; i != g.Settings.Size; i++)
    {
        const ImGuiIniData* settings = &g.Settings[i];
        if (settings->Pos.x == FLT_MAX)
            continue;
        const char* name = settings->Name;
        if (const char* p = strstr(name, "###"))  // Skip to the "###" marker if any. We don't skip past to match the behavior of GetID()
            name = p;
        fprintf(f, "[%s]\n", name);
        fprintf(f, "Pos=%d,%d\n", (int)settings->Pos.x, (int)settings->Pos.y);
        fprintf(f, "Size=%d,%d\n", (int)settings->Size.x, (int)settings->Size.y);
        fprintf(f, "Collapsed=%d\n", settings->Collapsed);
        fprintf(f, "\n");
    }

    fclose(f);
}